

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScannerException.cpp
# Opt level: O0

ANTLRException * __thiscall ScannerException::toString_abi_cxx11_(ScannerException *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  ANTLRException *in_RDI;
  ANTLRException *__rhs;
  string local_c8 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff6c;
  allocator local_71;
  string local_70 [32];
  string local_50 [32];
  string local_30 [48];
  
  __rhs = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"line(",&local_71);
  std::__cxx11::to_string(in_stack_ffffffffffffff6c);
  std::operator+(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::operator+(in_RSI,(char *)__rhs);
  ANTLRException::getMessage_abi_cxx11_(in_RDI);
  std::operator+(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff58);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  return __rhs;
}

Assistant:

std::string ScannerException::toString() const
{
	return std::string("line(")+std::to_string(line)+"), "+getMessage();
}